

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

void Llb_ManGroupCreate_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  iVar1 = pAig->nTravIds;
  if (pObj->TravId != iVar1) {
    do {
      pObj->TravId = iVar1;
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      uVar2 = (uint)*(ulong *)&pObj->field_0x18 & 7;
      if (uVar2 == 1) {
        return;
      }
      if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
        uVar2 = vSupp->nSize;
        if (uVar2 == vSupp->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vSupp->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vSupp->pArray,0x80);
            }
            vSupp->pArray = ppvVar3;
            vSupp->nCap = 0x10;
          }
          else {
            if (vSupp->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(vSupp->pArray,(ulong)uVar2 << 4);
            }
            vSupp->pArray = ppvVar3;
            vSupp->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar3 = vSupp->pArray;
        }
        iVar1 = vSupp->nSize;
        vSupp->nSize = iVar1 + 1;
        ppvVar3[iVar1] = pObj;
        return;
      }
      if (uVar2 != 5) {
        __assert_fail("Aig_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                      ,0x9f,"void Llb_ManGroupCreate_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      Llb_ManGroupCreate_rec(pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar1 = pAig->nTravIds;
    } while (pObj->TravId != iVar1);
  }
  return;
}

Assistant:

void Llb_ManGroupCreate_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{ 
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsAnd(pObj) );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin0(pObj), vSupp );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin1(pObj), vSupp );
}